

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void secp256k1_memczero(void *s,size_t len,int flag)

{
  uchar mask;
  int vflag;
  uchar *p;
  int flag_local;
  size_t len_local;
  void *s_local;
  
  p = (uchar *)s;
  for (len_local = len; len_local != 0; len_local = len_local - 1) {
    *p = *p & (-(char)flag ^ 0xffU);
    p = p + 1;
  }
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_memczero(void *s, size_t len, int flag) {
    unsigned char *p = (unsigned char *)s;
    /* Access flag with a volatile-qualified lvalue.
       This prevents clang from figuring out (after inlining) that flag can
       take only be 0 or 1, which leads to variable time code. */
    volatile int vflag = flag;
    unsigned char mask = -(unsigned char) vflag;
    while (len) {
        *p &= ~mask;
        p++;
        len--;
    }
}